

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

int unescapestring(char *dst,char *src,char *end)

{
  char cVar1;
  char *pcVar2;
  int e;
  int c;
  char *start;
  char *end_local;
  char *src_local;
  char *dst_local;
  
  end_local = src;
  src_local = dst;
  while (end_local < end) {
    pcVar2 = end_local + 1;
    if (*end_local == '^') {
      if (end <= pcVar2) break;
      end_local = end_local + 2;
      cVar1 = *pcVar2;
      if (cVar1 == 'f') {
        *src_local = '\f';
      }
      else if (cVar1 == 'n') {
        *src_local = '\n';
      }
      else if (cVar1 == 't') {
        *src_local = '\t';
      }
      else {
        *src_local = cVar1;
      }
    }
    else {
      *src_local = *end_local;
      end_local = pcVar2;
    }
    src_local = src_local + 1;
  }
  return (int)src_local - (int)dst;
}

Assistant:

int unescapestring(char *dst, const char *src, const char *end)
{
    char *start = dst;
    while(src < end)
    {
        int c = *src++;
        if(c == '^')
        {
            if(src >= end) break;
            int e = *src++;
            switch(e)
            {
                case 'n': *dst++ = '\n'; break;
                case 't': *dst++ = '\t'; break;
                case 'f': *dst++ = '\f'; break;
                default: *dst++ = e; break;
            }
        }
        else *dst++ = c;
    }
    return dst - start;
}